

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::BindResources(ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  undefined *puVar1;
  BIND_SHADER_RESOURCES_FLAGS BVar2;
  int iVar3;
  PipelineResourceDesc *ResDesc_00;
  IDeviceObject *pIVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  char (*in_R8) [157];
  String local_a8;
  undefined1 local_88 [8];
  string _msg;
  SET_SHADER_RESOURCE_FLAGS SetResFlags;
  IDeviceObject *pObj;
  Uint32 ArrInd;
  PipelineResourceDesc *ResDesc;
  ImageBindInfo *pThis;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  ShaderVariableBase<Diligent::ShaderVariableManagerGL::ImageBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
  *this_local;
  
  ResDesc_00 = GetDesc(this);
  if ((Flags & 1 << (ResDesc_00->VarType & 0x1f)) != 0) {
    for (pObj._4_4_ = 0; pObj._4_4_ < ResDesc_00->ArraySize; pObj._4_4_ = pObj._4_4_ + 1) {
      BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_KEEP_EXISTING);
      if ((BVar2 == 0) ||
         (pIVar4 = ShaderVariableManagerGL::ImageBindInfo::Get((ImageBindInfo *)this,pObj._4_4_),
         pIVar4 == (IDeviceObject *)0x0)) {
        iVar3 = (*(pResourceMapping->super_IObject)._vptr_IObject[7])
                          (pResourceMapping,ResDesc_00->Name,(ulong)pObj._4_4_);
        if ((IDeviceObject *)CONCAT44(extraout_var,iVar3) == (IDeviceObject *)0x0) {
          BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED);
          if ((BVar2 != 0) &&
             (pIVar4 = ShaderVariableManagerGL::ImageBindInfo::Get((ImageBindInfo *)this,pObj._4_4_)
             , pIVar4 == (IDeviceObject *)0x0)) {
            GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                      (&local_a8,ResDesc_00,pObj._4_4_);
            FormatString<char[45],std::__cxx11::string,char[157]>
                      ((string *)local_88,
                       (Diligent *)"Unable to bind resource to shader variable \'",
                       (char (*) [45])&local_a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\': resource is not found in the resource mapping. Do not use BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED flag to suppress the message if this is not an issue."
                       ,in_R8);
            std::__cxx11::string::~string((string *)&local_a8);
            puVar1 = DebugMessageCallback;
            if (DebugMessageCallback != (undefined *)0x0) {
              uVar5 = std::__cxx11::string::c_str();
              in_R8 = (char (*) [157])0x0;
              (*(code *)puVar1)(2,uVar5,0);
            }
            std::__cxx11::string::~string((string *)local_88);
          }
        }
        else {
          BVar2 = Diligent::operator&(Flags,BIND_SHADER_RESOURCES_ALLOW_OVERWRITE);
          in_R8 = (char (*) [157])0x0;
          BindResourceInfo::BindResourceInfo
                    ((BindResourceInfo *)((long)&_msg.field_2 + 8),pObj._4_4_,
                     (IDeviceObject *)CONCAT44(extraout_var,iVar3),(uint)(BVar2 != 0),0,0);
          ShaderVariableManagerGL::ImageBindInfo::BindResource
                    ((ImageBindInfo *)this,(BindResourceInfo *)((long)&_msg.field_2 + 8));
        }
      }
    }
  }
  return;
}

Assistant:

void BindResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags)
    {
        ThisImplType* const         pThis   = static_cast<ThisImplType*>(this);
        const PipelineResourceDesc& ResDesc = pThis->GetDesc();

        if ((Flags & (1u << ResDesc.VarType)) == 0)
            return;

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            if ((Flags & BIND_SHADER_RESOURCES_KEEP_EXISTING) != 0 && pThis->Get(ArrInd) != nullptr)
                continue;

            if (IDeviceObject* pObj = pResourceMapping->GetResource(ResDesc.Name, ArrInd))
            {
                const SET_SHADER_RESOURCE_FLAGS SetResFlags = (Flags & BIND_SHADER_RESOURCES_ALLOW_OVERWRITE) != 0 ?
                    SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE :
                    SET_SHADER_RESOURCE_FLAG_NONE;
                pThis->BindResource(BindResourceInfo{ArrInd, pObj, SetResFlags});
            }
            else
            {
                if ((Flags & BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED) && pThis->Get(ArrInd) == nullptr)
                {
                    LOG_ERROR_MESSAGE("Unable to bind resource to shader variable '",
                                      GetShaderResourcePrintName(ResDesc, ArrInd),
                                      "': resource is not found in the resource mapping. "
                                      "Do not use BIND_SHADER_RESOURCES_VERIFY_ALL_RESOLVED flag to suppress the message if this is not an issue.");
                }
            }
        }
    }